

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> __thiscall
SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
          (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *this,
          unsigned_long_long rhs)

{
  unsigned_long_long in_RSI;
  short *in_RDI;
  short local_1a [12];
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2;
  
  local_1a[0] = BinaryAndHelper<short,_unsigned_long_long,_0>::And(*in_RDI,in_RSI);
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_2,local_1a);
  return (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_2.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator &( U rhs ) const SAFEINT_NOTHROW
    {
        // we want to avoid setting bits by surprise
        // consider the case of lhs = int, value = 0xffffffff
        //                      rhs = char, value = 0xff
        //
        // programmer intent is to get only the lower 8 bits
        // normal behavior is to upcast both sides to an int
        // which then sign extends rhs, setting all the bits

        // If you land in the assert, this is because the bitwise operator
        // was causing unexpected behavior. Fix is to properly cast your inputs
        // so that it works like you meant, not unexpectedly

        return SafeInt< T, E >( BinaryAndHelper< T, U, BinaryMethod< T, U >::method >::And( m_int, rhs ) );
    }